

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_TimedText.cpp
# Opt level: O3

MXFReader * __thiscall
ASDCP::TimedText::MXFReader::ReadAncillaryResource
          (MXFReader *this,byte_t *uuid,FrameBuffer *FrameBuf,AESDecContext *Ctx,HMACContext *HMAC)

{
  char cVar1;
  
  if ((*(long *)(uuid + 8) != 0) &&
     (cVar1 = (**(code **)(**(long **)(*(long *)(uuid + 8) + 0x10) + 0x40))(), cVar1 != '\0')) {
    h__Reader::ReadAncillaryResource((h__Reader *)this,*(byte_t **)(uuid + 8),FrameBuf,Ctx,HMAC);
    return this;
  }
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_INIT);
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::TimedText::MXFReader::ReadAncillaryResource(const byte_t* uuid, FrameBuffer& FrameBuf,
						   AESDecContext* Ctx, HMACContext* HMAC) const
{
  if ( m_Reader && m_Reader->m_File->IsOpen() )
    return m_Reader->ReadAncillaryResource(uuid, FrameBuf, Ctx, HMAC);

  return RESULT_INIT;
}